

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  int iVar1;
  pair<const_char_*,_bool> pVar2;
  
  iVar1 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  while( true ) {
    if (this->limit_ == 0x10) {
      return (char *)0x0;
    }
    pVar2 = DoneFallback(this,ptr + iVar1,-1);
    ptr = pVar2.first;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    size = size - iVar1;
    iVar1 = (*(int *)&this->buffer_end_ - (int)pVar2.first) + 0x10;
    if (size <= iVar1) {
      return ptr + size;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* p, int s) {});
}